

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgem.cpp
# Opt level: O2

void test_draw_fns(Am_Drawonable *d)

{
  (**(code **)(*(long *)d + 0xa0))();
  (**(code **)(*(long *)d + 0x160))(d,&Am_No_Style,&black,0x32,2,0x14,0xaf,0);
  (**(code **)(*(long *)d + 0xa0))(d);
  (**(code **)(*(long *)d + 0x160))(d,&Am_No_Style,&black,10,10,100,0x14,0);
  (**(code **)(*(long *)d + 0x160))(d,&Am_No_Style,&gray_stipple,10,0x37,100,0x14,2);
  (**(code **)(*(long *)d + 0x160))(d,&black,&Am_No_Style,10,0x6e,100,0x14,1);
  (**(code **)(*(long *)d + 0x160))(d,&black,&white,10,0x96,100,0x14,2);
  (**(code **)(*(long *)d + 0xa0))(d);
  return;
}

Assistant:

void
test_draw_fns(Am_Drawonable *d)
{
  d->Flush_Output();

  // Reference rectangle (vertical)
  d->Draw_Rectangle(Am_No_Style, black, 50, 2, 20, 175);
  d->Flush_Output();

  d->Draw_Rectangle(Am_No_Style, black, 10, 10, 100, 20);

  d->Draw_Rectangle(Am_No_Style, gray_stipple, 10, 55, 100, 20, Am_DRAW_XOR);

  d->Draw_Rectangle(black, Am_No_Style, 10, 110, 100, 20, Am_DRAW_OR);

  d->Draw_Rectangle(black, white, 10, 150, 100, 20, Am_DRAW_XOR);
  d->Flush_Output();
}